

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

string * __thiscall
phosg::vformat_color_escape_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,TerminalFormat color,__va_list_tag *va)

{
  uint uVar1;
  uint *puVar2;
  undefined4 in_register_00000014;
  uint *puVar3;
  ulong uVar4;
  string local_40;
  
  puVar3 = (uint *)CONCAT44(in_register_00000014,color);
  uVar4 = (ulong)this & 0xffffffff;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"\x1b",(allocator<char> *)&local_40);
  do {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,
               ((__return_storage_ptr__->_M_dataplus)._M_p
                [__return_storage_ptr__->_M_string_length - 1] == '\x1b') * ' ' + ';');
    ::std::__cxx11::to_string(&local_40,(int)uVar4);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    uVar1 = *puVar3;
    if ((ulong)uVar1 < 0x29) {
      puVar2 = (uint *)((ulong)uVar1 + *(long *)(puVar3 + 4));
      *puVar3 = uVar1 + 8;
    }
    else {
      puVar2 = *(uint **)(puVar3 + 2);
      *(uint **)(puVar3 + 2) = puVar2 + 2;
    }
    uVar4 = (ulong)*puVar2;
  } while (*puVar2 != 0xffffffff);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,'m');
  return __return_storage_ptr__;
}

Assistant:

string vformat_color_escape(TerminalFormat color, va_list va) {
  string fmt("\033");

  do {
    fmt += (fmt[fmt.size() - 1] == '\033') ? '[' : ';';
    fmt += to_string((int)color);
    color = va_arg(va, TerminalFormat);
  } while (color != TerminalFormat::END);

  fmt += 'm';
  return fmt;
}